

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O0

void __thiscall luabridge::Namespace::Namespace(Namespace *this,char *name,Namespace *parent)

{
  lua_State *plVar1;
  int iVar2;
  void *pvVar3;
  Namespace *parent_local;
  char *name_local;
  Namespace *this_local;
  
  detail::Registrar::Registrar(&this->super_Registrar,&parent->super_Registrar);
  iVar2 = lua_type((this->super_Registrar).L,-1);
  if (iVar2 == 5) {
    rawgetfield((this->super_Registrar).L,-1,name);
    iVar2 = lua_type((this->super_Registrar).L,-1);
    if (iVar2 == 0) {
      lua_settop((this->super_Registrar).L,-2);
      lua_createtable((this->super_Registrar).L,0,0);
      lua_pushvalue((this->super_Registrar).L,-1);
      lua_setmetatable((this->super_Registrar).L,-2);
      lua_pushcclosure((this->super_Registrar).L,detail::CFunc::indexMetaMethod,0);
      rawsetfield((this->super_Registrar).L,-2,"__index");
      lua_pushcclosure((this->super_Registrar).L,detail::CFunc::newindexStaticMetaMethod,0);
      rawsetfield((this->super_Registrar).L,-2,"__newindex");
      lua_createtable((this->super_Registrar).L,0,0);
      plVar1 = (this->super_Registrar).L;
      pvVar3 = detail::getPropgetKey();
      lua_rawsetp(plVar1,-2,pvVar3);
      lua_createtable((this->super_Registrar).L,0,0);
      plVar1 = (this->super_Registrar).L;
      pvVar3 = detail::getPropsetKey();
      lua_rawsetp(plVar1,-2,pvVar3);
      lua_pushvalue((this->super_Registrar).L,-1);
      rawsetfield((this->super_Registrar).L,-3,name);
    }
    (this->super_Registrar).m_stackSize = (this->super_Registrar).m_stackSize + 1;
    return;
  }
  __assert_fail("lua_istable(L, -1)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                ,0x3f8,"luabridge::Namespace::Namespace(const char *, Namespace &)");
}

Assistant:

Namespace(char const* name, Namespace& parent) : Registrar(parent)
    {
        assert(lua_istable(L, -1)); // Stack: parent namespace (pns)

        rawgetfield(L, -1, name); // Stack: pns, namespace (ns) | nil

        if (lua_isnil(L, -1)) // Stack: pns, nil
        {
            lua_pop(L, 1); // Stack: pns

            lua_newtable(L); // Stack: pns, ns
            lua_pushvalue(L, -1); // Stack: pns, ns, ns

            // na.__metatable = ns
            lua_setmetatable(L, -2); // Stack: pns, ns

            // ns.__index = indexMetaMethod
            lua_pushcfunction(L, &CFunc::indexMetaMethod);
            rawsetfield(L, -2, "__index"); // Stack: pns, ns

            // ns.__newindex = newindexMetaMethod
            lua_pushcfunction(L, &CFunc::newindexStaticMetaMethod);
            rawsetfield(L, -2, "__newindex"); // Stack: pns, ns

            lua_newtable(L); // Stack: pns, ns, propget table (pg)
            lua_rawsetp(L, -2, detail::getPropgetKey()); // ns [propgetKey] = pg. Stack: pns, ns

            lua_newtable(L); // Stack: pns, ns, propset table (ps)
            lua_rawsetp(L, -2, detail::getPropsetKey()); // ns [propsetKey] = ps. Stack: pns, ns

            // pns [name] = ns
            lua_pushvalue(L, -1); // Stack: pns, ns, ns
            rawsetfield(L, -3, name); // Stack: pns, ns
#if 0
      lua_pushcfunction (L, &tostringMetaMethod);
      rawsetfield (L, -2, "__tostring");
#endif
        }

        ++m_stackSize;
    }